

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PStruct::ReadFields(PStruct *this,FArchive *ar,void *addr)

{
  PSymbol *pPVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  FName local_44;
  DObject *local_40;
  PSymbol *sym;
  char *label;
  void *pvStack_28;
  bool readsomething;
  void *addr_local;
  FArchive *ar_local;
  PStruct *this_local;
  
  label._7_1_ = 0;
  pvStack_28 = addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  sym = (PSymbol *)FArchive::ReadName(ar);
  if (sym == (PSymbol *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    while (sym != (PSymbol *)0x0) {
      FName::FName(&local_44,(char *)sym,true);
      local_40 = &PSymbolTable::FindSymbol
                            (&(this->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                             &local_44,true)->super_DObject;
      pPVar1 = sym;
      if (local_40 == (DObject *)0x0) {
        pcVar4 = FName::GetChars(&(this->super_PNamedType).TypeName);
        DPrintf(1,"Cannot find field %s in %s\n",pPVar1,pcVar4);
        PType::SkipValue((FArchive *)addr_local);
      }
      else {
        bVar2 = DObject::IsKindOf(local_40,PField::RegistrationInfo.MyClass);
        pPVar1 = sym;
        if (bVar2) {
          uVar3 = (*((local_40[1].Class)->super_PStruct).super_PNamedType.super_PCompoundType.
                    super_PType.super_DObject._vptr_DObject[8])
                            (local_40[1].Class,addr_local,
                             (long)pvStack_28 + (ulong)*(uint *)&local_40[1]._vptr_DObject);
          label._7_1_ = (label._7_1_ & 1) != 0 || (uVar3 & 1) != 0;
        }
        else {
          pcVar4 = FName::GetChars(&(this->super_PNamedType).TypeName);
          DPrintf(1,"Symbol %s in %s is not a field\n",pPVar1,pcVar4);
          PType::SkipValue((FArchive *)addr_local);
        }
      }
      sym = (PSymbol *)FArchive::ReadName((FArchive *)addr_local);
    }
    this_local._7_1_ = (bool)(label._7_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool PStruct::ReadFields(FArchive &ar, void *addr) const
{
	bool readsomething = false;
	const char *label = ar.ReadName();
	if (label == NULL)
	{ // If there is nothing to restore, we count it as success.
		return true;
	}
	for (; label != NULL; label = ar.ReadName())
	{
		const PSymbol *sym = Symbols.FindSymbol(FName(label, true), true);
		if (sym == NULL)
		{
			DPrintf(DMSG_ERROR, "Cannot find field %s in %s\n",
				label, TypeName.GetChars());
			SkipValue(ar);
		}
		else if (!sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			DPrintf(DMSG_ERROR, "Symbol %s in %s is not a field\n",
				label, TypeName.GetChars());
			SkipValue(ar);
		}
		else
		{
			readsomething |= static_cast<const PField *>(sym)->Type->ReadValue(ar,
				(BYTE *)addr + static_cast<const PField *>(sym)->Offset);
		}
	}
	return readsomething;
}